

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EpsRefine.h
# Opt level: O1

ostream * covenant::operator<<(ostream *o,GeneralizationMethod gen)

{
  string *psVar1;
  long lVar2;
  char *pcVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (gen == MAX_GEN) {
    pcVar3 = "max-gen";
    lVar2 = 7;
  }
  else {
    if (gen != GREEDY) {
      psVar1 = (string *)__cxa_allocate_exception(0x20);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"invalid generalization method","");
      *(string **)psVar1 = psVar1 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar1,local_40,local_40 + local_38);
      __cxa_throw(psVar1,&error::typeinfo,error::~error);
    }
    pcVar3 = "greedy";
    lVar2 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar3,lVar2);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, GeneralizationMethod gen)
{
    if (gen == GREEDY)
      o << "greedy";
    else if (gen == MAX_GEN)
      o << "max-gen";
    else 
      throw error("invalid generalization method");
    return o;
}